

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I444ToARGBRow_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)width;
  if (width < 1) {
    uVar1 = uVar2;
  }
  for (; (int)uVar1 != (int)uVar2; uVar2 = uVar2 + 1) {
    libyuv::YuvPixel(src_y[uVar2],src_u[uVar2],src_v[uVar2],rgb_buf,rgb_buf + 1,rgb_buf + 2,
                     yuvconstants);
    rgb_buf[3] = 0xff;
    rgb_buf = rgb_buf + 4;
  }
  return;
}

Assistant:

void I444ToARGBRow_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width; ++x) {
    YuvPixel(src_y[0], src_u[0], src_v[0], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    src_y += 1;
    src_u += 1;
    src_v += 1;
    rgb_buf += 4;  // Advance 1 pixel.
  }
}